

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mock.hpp
# Opt level: O0

void __thiscall
ut11::Mock<int(char)>::VerifyTimes<int,char>
          (Mock<int(char)> *this,string *param_2,string *param_3,char *param_4,char *param_5)

{
  string *line;
  Mock<int(char)> local_80 [32];
  string local_60 [32];
  size_t local_40;
  size_t actual;
  char *expectations_local;
  int *count_local;
  string *file_local;
  size_t line_local;
  Mock<int_(char)> *this_local;
  
  actual = (size_t)param_5;
  expectations_local = param_4;
  count_local = (int *)param_3;
  file_local = param_2;
  line_local = (size_t)this;
  local_40 = detail::MockArgumentHandler<char>::CountCalls<char>
                       ((MockArgumentHandler<char> *)(this + 0x20),*param_5);
  line = file_local;
  if (local_40 != (long)*(int *)expectations_local) {
    std::__cxx11::string::string(local_60,param_3);
    GetVerifyFailTimesMessageForCount_abi_cxx11_
              (local_80,(size_t)this,(long)*(int *)expectations_local);
    Assert::Fail((size_t)line,(string *)local_60,(string *)local_80);
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string(local_60);
  }
  return;
}

Assistant:

void VerifyTimes(std::true_type isOperand, std::size_t line, std::string file, const Count& count, const Expectations&... expectations) const
		{
			auto actual = m_argumentHandler.CountCalls(expectations...);
			if ( actual != count )
				Assert::Fail(line, file, GetVerifyFailTimesMessageForCount(count, actual));
		}